

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

size_t recurse_longform(long integer,uint8_t *buf,int max)

{
  size_t sVar1;
  int stuff;
  int max_local;
  uint8_t *buf_local;
  long integer_local;
  
  if (integer < 0x80) {
    integer_local = 0;
  }
  else {
    sVar1 = recurse_longform(integer / 0x80,buf,max + -1);
    buf[(int)sVar1] = (byte)(integer / 0x80) | 0x80;
    integer_local = (long)((int)sVar1 + 1);
  }
  return integer_local;
}

Assistant:

static size_t recurse_longform(long integer, uint8_t* buf, int max){
    if(integer < 128){
        return 0;
    } else {
        int stuff = recurse_longform(integer / 128, buf, max - 1);
        buf[stuff] = ((integer / 128) | 0x80) & 0xFF;
        return stuff + 1;
    }
}